

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre.cc
# Opt level: O0

bool __thiscall
re2::PCRE::PartialMatchFunctor::operator()
          (PartialMatchFunctor *this,StringPiece *text,PCRE *re,Arg *a0,Arg *a1,Arg *a2,Arg *a3,
          Arg *a4,Arg *a5,Arg *a6,Arg *a7,Arg *a8,Arg *a9,Arg *a10,Arg *a11,Arg *a12,Arg *a13,
          Arg *a14,Arg *a15)

{
  bool bVar1;
  int local_198 [2];
  int vec [51];
  int local_c0;
  int local_bc;
  int consumed;
  int n;
  Arg *args [16];
  Arg *a2_local;
  Arg *a1_local;
  Arg *a0_local;
  PCRE *re_local;
  StringPiece *text_local;
  PartialMatchFunctor *this_local;
  
  local_bc = 0;
  if ((((a0 != (Arg *)no_more_args) && (local_bc = 1, _consumed = a0, a1 != (Arg *)no_more_args)) &&
      (local_bc = 2, args[0] = a1, a2 != (Arg *)no_more_args)) &&
     (local_bc = 3, args[1] = a2, a3 != (Arg *)no_more_args)) {
    local_bc = 4;
    args[2] = a3;
    if (a4 != (Arg *)no_more_args) {
      local_bc = 5;
      args[3] = a4;
      if (a5 != (Arg *)no_more_args) {
        local_bc = 6;
        args[4] = a5;
        if (a6 != (Arg *)no_more_args) {
          local_bc = 7;
          args[5] = a6;
          if (a7 != (Arg *)no_more_args) {
            local_bc = 8;
            args[6] = a7;
            if (a8 != (Arg *)no_more_args) {
              local_bc = 9;
              args[7] = a8;
              if (a9 != (Arg *)no_more_args) {
                local_bc = 10;
                args[8] = a9;
                if (a10 != (Arg *)no_more_args) {
                  local_bc = 0xb;
                  args[9] = a10;
                  if (a11 != (Arg *)no_more_args) {
                    local_bc = 0xc;
                    args[10] = a11;
                    if (a12 != (Arg *)no_more_args) {
                      local_bc = 0xd;
                      args[0xb] = a12;
                      if (a13 != (Arg *)no_more_args) {
                        local_bc = 0xe;
                        args[0xc] = a13;
                        if (a14 != (Arg *)no_more_args) {
                          local_bc = 0xf;
                          args[0xd] = a14;
                          if (a15 != (Arg *)no_more_args) {
                            local_bc = 0x10;
                            args[0xe] = a15;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  args[0xf] = a2;
  memset(local_198,0,0xcc);
  bVar1 = DoMatchImpl(re,text,UNANCHORED,&local_c0,(Arg **)&consumed,local_bc,local_198,0x33);
  return bVar1;
}

Assistant:

bool PCRE::PartialMatchFunctor::operator ()(const StringPiece& text,
                                          const PCRE& re,
                                          const Arg& a0,
                                          const Arg& a1,
                                          const Arg& a2,
                                          const Arg& a3,
                                          const Arg& a4,
                                          const Arg& a5,
                                          const Arg& a6,
                                          const Arg& a7,
                                          const Arg& a8,
                                          const Arg& a9,
                                          const Arg& a10,
                                          const Arg& a11,
                                          const Arg& a12,
                                          const Arg& a13,
                                          const Arg& a14,
                                          const Arg& a15) const {
  const Arg* args[kMaxArgs];
  int n = 0;
  if (&a0 == &no_more_args)  goto done; args[n++] = &a0;
  if (&a1 == &no_more_args)  goto done; args[n++] = &a1;
  if (&a2 == &no_more_args)  goto done; args[n++] = &a2;
  if (&a3 == &no_more_args)  goto done; args[n++] = &a3;
  if (&a4 == &no_more_args)  goto done; args[n++] = &a4;
  if (&a5 == &no_more_args)  goto done; args[n++] = &a5;
  if (&a6 == &no_more_args)  goto done; args[n++] = &a6;
  if (&a7 == &no_more_args)  goto done; args[n++] = &a7;
  if (&a8 == &no_more_args)  goto done; args[n++] = &a8;
  if (&a9 == &no_more_args)  goto done; args[n++] = &a9;
  if (&a10 == &no_more_args) goto done; args[n++] = &a10;
  if (&a11 == &no_more_args) goto done; args[n++] = &a11;
  if (&a12 == &no_more_args) goto done; args[n++] = &a12;
  if (&a13 == &no_more_args) goto done; args[n++] = &a13;
  if (&a14 == &no_more_args) goto done; args[n++] = &a14;
  if (&a15 == &no_more_args) goto done; args[n++] = &a15;
done:

  int consumed;
  int vec[kVecSize] = {};
  return re.DoMatchImpl(text, UNANCHORED, &consumed, args, n, vec, kVecSize);
}